

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::vertexInfeasible
          (HighsCliqueTable *this,HighsDomain *globaldom,HighsInt col,HighsInt val)

{
  HighsInt val_local;
  HighsInt col_local;
  double local_20;
  double local_18;
  
  local_18 = (globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[col];
  local_20 = (globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[col];
  val_local = val;
  col_local = col;
  HighsDomain::fixCol(globaldom,col,(double)(1 - val),(Reason)0xfffffffe);
  if (globaldom->infeasible_ == false) {
    if ((local_18 != local_20) || (NAN(local_18) || NAN(local_20))) {
      this->nfixings = this->nfixings + 1;
    }
    std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
    emplace_back<int&,int&>
              ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
               &this->infeasvertexstack,&col_local,&val_local);
    processInfeasibleVertices(this,globaldom);
  }
  return;
}

Assistant:

void HighsCliqueTable::vertexInfeasible(HighsDomain& globaldom, HighsInt col,
                                        HighsInt val) {
  bool wasfixed = globaldom.isFixed(col);
  globaldom.fixCol(col, double(1 - val));
  if (globaldom.infeasible()) return;
  if (!wasfixed) ++nfixings;
  infeasvertexstack.emplace_back(col, val);
  processInfeasibleVertices(globaldom);
}